

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadhash.cpp
# Opt level: O0

uint64_t SS_AwareHash(uchar *data,uint64_t n,uint64_t hash,uint64_t scale,uint64_t hardener)

{
  char tmp;
  uint64_t hardener_local;
  uint64_t scale_local;
  uint64_t hash_local;
  uint64_t n_local;
  uchar *data_local;
  
  tmp = '\0';
  hash_local = hash;
  data_local = data;
  for (n_local = n << 1; n_local != 0; n_local = n_local - 1) {
    if ((n_local & 1) == 0) {
      tmp = *data_local;
      data_local = data_local + 1;
    }
    hash_local = (long)(((int)tmp >> (sbyte)((n_local & 1) << 2)) %
                       (1 << (((byte)n_local & 1) + 1) * '\x04')) + scale * hash_local;
  }
  return hash_local ^ hardener;
}

Assistant:

uint64_t SS_AwareHash(unsigned char* data, uint64_t n,
	uint64_t hash, uint64_t scale, uint64_t hardener) {
	n = 2 * n;
	char tmp = 0;
	while (n) {
		hash *= scale;
		if (n % 2 == 0)
			tmp = *data++;
		hash += (tmp >> (n % 2) * 4) % (1 << (n % 2 + 1) * 4);
		n--;
	}
	return hash ^ hardener;
}